

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O2

void DrawRingLines(Vector2 center,float innerRadius,float outerRadius,float startAngle,
                  float endAngle,int segments,Color color)

{
  int iVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float local_84;
  float local_48;
  float fStack_44;
  
  if ((startAngle == endAngle) && (!NAN(startAngle) && !NAN(endAngle))) {
    return;
  }
  fVar8 = (float)(~-(uint)(outerRadius < innerRadius) & (uint)outerRadius |
                 (~-(uint)(0.0 < innerRadius) & 0x3dcccccd |
                 -(uint)(0.0 < innerRadius) & (uint)innerRadius) &
                 -(uint)(outerRadius < innerRadius));
  if (innerRadius <= outerRadius) {
    outerRadius = innerRadius;
  }
  local_84 = endAngle;
  if (startAngle <= endAngle) {
    local_84 = startAngle;
    startAngle = endAngle;
  }
  fVar3 = startAngle - local_84;
  fVar4 = ceilf(fVar3 / 90.0);
  if (segments < (int)fVar4) {
    fVar5 = -0.5 / fVar8 + 1.0;
    fVar5 = fVar5 * fVar5;
    fVar5 = acosf(fVar5 + fVar5 + -1.0);
    fVar5 = ceilf(6.2831855 / fVar5);
    iVar1 = (int)((fVar5 * fVar3) / 360.0);
    segments = (int)fVar4;
    if (0 < iVar1) {
      segments = iVar1;
    }
  }
  if (0.0 < outerRadius) {
    rlBegin(1);
    rlColor4ub(color.r,color.g,color.b,color.a);
    fVar4 = local_84 * 0.017453292;
    fVar5 = cosf(fVar4);
    local_48 = center.x;
    fStack_44 = center.y;
    fVar6 = sinf(fVar4);
    rlVertex2f(fVar5 * fVar8 + local_48,fVar6 * fVar8 + fStack_44);
    fVar5 = cosf(fVar4);
    fVar4 = sinf(fVar4);
    rlVertex2f(fVar5 * outerRadius + local_48,fStack_44 + fVar4 * outerRadius);
    iVar1 = 0;
    if (0 < segments) {
      iVar1 = segments;
    }
    while( true ) {
      rlColor4ub(color.r,color.g,color.b,color.a);
      fVar4 = local_84 * 0.017453292;
      fVar5 = cosf(fVar4);
      fVar6 = sinf(fVar4);
      rlVertex2f(fVar5 * fVar8 + local_48,fVar6 * fVar8 + fStack_44);
      bVar2 = iVar1 == 0;
      iVar1 = iVar1 + -1;
      if (bVar2) break;
      local_84 = local_84 + fVar3 / (float)segments;
      fVar5 = local_84 * 0.017453292;
      fVar6 = cosf(fVar5);
      fVar7 = sinf(fVar5);
      rlVertex2f(fVar6 * fVar8 + local_48,fVar7 * fVar8 + fStack_44);
      fVar6 = cosf(fVar4);
      fVar4 = sinf(fVar4);
      rlVertex2f(fVar6 * outerRadius + local_48,fVar4 * outerRadius + fStack_44);
      fVar4 = cosf(fVar5);
      fVar5 = sinf(fVar5);
      rlVertex2f(fVar4 * outerRadius + local_48,fVar5 * outerRadius + fStack_44);
    }
    fVar8 = cosf(fVar4);
    fVar3 = sinf(fVar4);
    rlVertex2f(fVar8 * outerRadius + local_48,outerRadius * fVar3 + fStack_44);
    rlEnd();
    return;
  }
  DrawCircleSectorLines(center,fVar8,local_84,startAngle,segments,color);
  return;
}

Assistant:

void DrawRingLines(Vector2 center, float innerRadius, float outerRadius, float startAngle, float endAngle, int segments, Color color)
{
    if (startAngle == endAngle) return;

    // Function expects (outerRadius > innerRadius)
    if (outerRadius < innerRadius)
    {
        float tmp = outerRadius;
        outerRadius = innerRadius;
        innerRadius = tmp;

        if (outerRadius <= 0.0f) outerRadius = 0.1f;
    }

    // Function expects (endAngle > startAngle)
    if (endAngle < startAngle)
    {
        // Swap values
        float tmp = startAngle;
        startAngle = endAngle;
        endAngle = tmp;
    }

    int minSegments = (int)ceilf((endAngle - startAngle)/90);

    if (segments < minSegments)
    {
        // Calculate the maximum angle between segments based on the error rate (usually 0.5f)
        float th = acosf(2*powf(1 - SMOOTH_CIRCLE_ERROR_RATE/outerRadius, 2) - 1);
        segments = (int)((endAngle - startAngle)*ceilf(2*PI/th)/360);

        if (segments <= 0) segments = minSegments;
    }

    if (innerRadius <= 0.0f)
    {
        DrawCircleSectorLines(center, outerRadius, startAngle, endAngle, segments, color);
        return;
    }

    float stepLength = (endAngle - startAngle)/(float)segments;
    float angle = startAngle;
    bool showCapLines = true;

    rlBegin(RL_LINES);
        if (showCapLines)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(center.x + cosf(DEG2RAD*angle)*outerRadius, center.y + sinf(DEG2RAD*angle)*outerRadius);
            rlVertex2f(center.x + cosf(DEG2RAD*angle)*innerRadius, center.y + sinf(DEG2RAD*angle)*innerRadius);
        }

        for (int i = 0; i < segments; i++)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);

            rlVertex2f(center.x + cosf(DEG2RAD*angle)*outerRadius, center.y + sinf(DEG2RAD*angle)*outerRadius);
            rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*outerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*outerRadius);

            rlVertex2f(center.x + cosf(DEG2RAD*angle)*innerRadius, center.y + sinf(DEG2RAD*angle)*innerRadius);
            rlVertex2f(center.x + cosf(DEG2RAD*(angle + stepLength))*innerRadius, center.y + sinf(DEG2RAD*(angle + stepLength))*innerRadius);

            angle += stepLength;
        }

        if (showCapLines)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f(center.x + cosf(DEG2RAD*angle)*outerRadius, center.y + sinf(DEG2RAD*angle)*outerRadius);
            rlVertex2f(center.x + cosf(DEG2RAD*angle)*innerRadius, center.y + sinf(DEG2RAD*angle)*innerRadius);
        }
    rlEnd();
}